

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

type_info * pybind11::detail::get_type_info(type_index *tp,bool throw_if_missing)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string tname;
  type_info *gtype;
  type_info *ltype;
  bool throw_if_missing_local;
  type_index *tp_local;
  
  tp_local = (type_index *)get_local_type_info(tp);
  if (((type_info *)tp_local == (type_info *)0x0) &&
     (tname.field_2._8_8_ = get_global_type_info(tp), tp_local = (type_index *)tname.field_2._8_8_,
     (type_info *)tname.field_2._8_8_ == (type_info *)0x0)) {
    if (throw_if_missing) {
      __s = std::type_index::name(tp);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_51);
      std::allocator<char>::~allocator(&local_51);
      clean_type_id((string *)local_50);
      std::operator+(&local_a8,"pybind11::detail::get_type_info: unable to find type info for \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::operator+(&local_88,&local_a8,"\"");
      pybind11_fail(&local_88);
    }
    tp_local = (type_index *)0x0;
  }
  return (type_info *)tp_local;
}

Assistant:

PYBIND11_NOINLINE detail::type_info *get_type_info(const std::type_index &tp,
                                                          bool throw_if_missing = false) {
    if (auto ltype = get_local_type_info(tp))
        return ltype;
    if (auto gtype = get_global_type_info(tp))
        return gtype;

    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \"" + tname + "\"");
    }
    return nullptr;
}